

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastTimer.cpp
# Opt level: O0

void __thiscall FastTimer::timerEvent(FastTimer *this,QTimerEvent *evt)

{
  int iVar1;
  CallbackFn p_Var2;
  void *pvVar3;
  int iVar4;
  void *data;
  CallbackFn callback;
  int timerId;
  QTimerEvent *evt_local;
  FastTimer *this_local;
  
  QBasicMutex::lock(&(this->mMutex).super_QBasicMutex);
  iVar1 = this->mTimerId;
  p_Var2 = this->mCallback;
  pvVar3 = this->mCallbackData;
  QBasicMutex::unlock(&(this->mMutex).super_QBasicMutex);
  iVar4 = QTimerEvent::timerId(evt);
  if ((iVar4 == iVar1) && (p_Var2 != (CallbackFn)0x0)) {
    (*p_Var2)(pvVar3);
  }
  return;
}

Assistant:

void FastTimer::timerEvent(QTimerEvent *evt) {
    mMutex.lock();
    auto const timerId = mTimerId;
    auto const callback = mCallback;
    auto const data = mCallbackData;
    mMutex.unlock();


    if (evt->timerId() == timerId && callback) {
        callback(data);
    }

}